

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_enter_working_dir(tree *t)

{
  wchar_t local_14;
  wchar_t r;
  tree *t_local;
  
  local_14 = L'\0';
  if (((0 < t->depth) && ((t->flags & 0x40U) == 0)) &&
     (local_14 = fchdir(t->working_dir_fd), local_14 == L'\0')) {
    t->flags = t->flags & 0xfffffeff;
    t->flags = t->flags | 0x40;
  }
  return local_14;
}

Assistant:

static int
tree_enter_working_dir(struct tree *t)
{
	int r = 0;

	/*
	 * Change the current directory if really needed.
	 * Sometimes this is unneeded when we did not do
	 * descent.
	 */
	if (t->depth > 0 && (t->flags & onWorkingDir) == 0) {
		r = fchdir(t->working_dir_fd);
		if (r == 0) {
			t->flags &= ~onInitialDir;
			t->flags |= onWorkingDir;
		}
	}
	return (r);
}